

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::SetWindowFontScale(float scale)

{
  ImGuiContext *pIVar1;
  ImGuiWindow *this;
  float in_XMM0_Da;
  float fVar2;
  ImGuiWindow *window;
  ImGuiContext *g;
  
  pIVar1 = GImGui;
  this = GetCurrentWindow();
  this->FontWindowScale = in_XMM0_Da;
  fVar2 = ImGuiWindow::CalcFontSize(this);
  (pIVar1->DrawListSharedData).FontSize = fVar2;
  pIVar1->FontSize = fVar2;
  fVar2 = pIVar1->FontSize / pIVar1->Font->FontSize;
  (pIVar1->DrawListSharedData).FontScale = fVar2;
  pIVar1->FontScale = fVar2;
  return;
}

Assistant:

void ImGui::SetWindowFontScale(float scale)
{
    IM_ASSERT(scale > 0.0f);
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = GetCurrentWindow();
    window->FontWindowScale = scale;
    g.FontSize = g.DrawListSharedData.FontSize = window->CalcFontSize();
    g.FontScale = g.DrawListSharedData.FontScale = g.FontSize / g.Font->FontSize;
}